

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_ru_u_row_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
               (void)

{
  allocator<unsigned_int> *this;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  bool bVar1;
  reference witness;
  Row *this_00;
  uint local_3fc;
  reference local_3f8;
  Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
  *entry;
  iterator __end0_1;
  iterator __begin0_1;
  Row *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *r;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  undefined1 local_3b0 [4];
  uint i;
  column_content<typename_Matrix<RU_rep_options_with_row_access<true,_(Column_types)7,_false,_false,_true,_true,_true,_true>_>::Column>
  orderedRows;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_368;
  allocator<unsigned_int> local_34d;
  uint local_34c [3];
  iterator local_340;
  size_type local_338;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_330;
  allocator<unsigned_int> local_315;
  uint local_314;
  iterator local_310;
  size_type local_308;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_300;
  allocator<unsigned_int> local_2e5;
  uint local_2e4;
  iterator local_2e0;
  size_type local_2d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2d0;
  allocator<unsigned_int> local_2b5;
  uint local_2b4;
  iterator local_2b0;
  size_type local_2a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2a0;
  allocator<unsigned_int> local_285;
  uint local_284;
  iterator local_280;
  size_type local_278;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_270;
  allocator<unsigned_int> local_255;
  uint local_254;
  iterator local_250;
  size_type local_248;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_240;
  undefined1 local_228 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rows;
  undefined1 local_200 [8];
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>
              *)local_200,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.operators_,5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_228);
  local_254 = 0;
  local_250 = &local_254;
  local_248 = 1;
  std::allocator<unsigned_int>::allocator(&local_255);
  __l_05._M_len = local_248;
  __l_05._M_array = local_250;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_240,__l_05,&local_255);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_228,&local_240);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_240);
  std::allocator<unsigned_int>::~allocator(&local_255);
  local_284 = 1;
  local_280 = &local_284;
  local_278 = 1;
  std::allocator<unsigned_int>::allocator(&local_285);
  __l_04._M_len = local_278;
  __l_04._M_array = local_280;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_270,__l_04,&local_285);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_228,&local_270);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_270);
  std::allocator<unsigned_int>::~allocator(&local_285);
  local_2b4 = 2;
  local_2b0 = &local_2b4;
  local_2a8 = 1;
  std::allocator<unsigned_int>::allocator(&local_2b5);
  __l_03._M_len = local_2a8;
  __l_03._M_array = local_2b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_2a0,__l_03,&local_2b5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_228,&local_2a0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_2a0);
  std::allocator<unsigned_int>::~allocator(&local_2b5);
  local_2e4 = 3;
  local_2e0 = &local_2e4;
  local_2d8 = 1;
  std::allocator<unsigned_int>::allocator(&local_2e5);
  __l_02._M_len = local_2d8;
  __l_02._M_array = local_2e0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_2d0,__l_02,&local_2e5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_228,&local_2d0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_2d0);
  std::allocator<unsigned_int>::~allocator(&local_2e5);
  local_314 = 4;
  local_310 = &local_314;
  local_308 = 1;
  std::allocator<unsigned_int>::allocator(&local_315);
  __l_01._M_len = local_308;
  __l_01._M_array = local_310;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_300,__l_01,&local_315);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_228,&local_300);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_300);
  std::allocator<unsigned_int>::~allocator(&local_315);
  local_34c[0] = 3;
  local_34c[1] = 4;
  local_34c[2] = 5;
  local_340 = local_34c;
  local_338 = 3;
  std::allocator<unsigned_int>::allocator(&local_34d);
  __l_00._M_len = local_338;
  __l_00._M_array = local_340;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_330,__l_00,&local_34d);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_228,&local_330);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_330);
  std::allocator<unsigned_int>::~allocator(&local_34d);
  orderedRows._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 6;
  this = (allocator<unsigned_int> *)
         ((long)&orderedRows._M_t._M_impl.super__Rb_tree_header._M_node_count + 3);
  std::allocator<unsigned_int>::allocator(this);
  __l._M_len = 1;
  __l._M_array = (iterator)((long)&orderedRows._M_t._M_impl.super__Rb_tree_header._M_node_count + 4)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_368,__l,this);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_228,&local_368);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_368);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&orderedRows._M_t._M_impl.super__Rb_tree_header._M_node_count + 3));
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_3b0)
  ;
  __range1._4_4_ = 0;
  __end0 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)local_228);
  r = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_228);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&r);
    if (!bVar1) break;
    witness = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&__end0);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::clear
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               local_3b0);
    this_00 = Gudhi::persistence_matrix::
              Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>
              ::get_row((Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>
                         *)local_200,__range1._4_4_,false);
    __end0_1 = std::
               set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>
               ::begin(this_00);
    entry = (Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
             *)std::
               set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>_>
               ::end(this_00);
    while( true ) {
      bVar1 = std::operator!=(&__end0_1,(_Self *)&entry);
      if (!bVar1) break;
      local_3f8 = std::
                  _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>
                  ::operator*(&__end0_1);
      local_3fc = Gudhi::persistence_matrix::Entry_column_index<unsigned_int>::get_column_index
                            (&local_3f8->super_Entry_column_index_option);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_3b0,&local_3fc);
      std::
      _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>
      ::operator++(&__end0_1);
    }
    test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>>
              (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>
                        *)local_3b0);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end0);
    __range1._4_4_ = __range1._4_4_ + 1;
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_3b0)
  ;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_228);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>
  ::~Matrix((Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>
             *)local_200);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.operators_);
  return;
}

Assistant:

void test_ru_u_row_access() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  std::vector<witness_content<typename Matrix::Column> > rows;
  if constexpr (Matrix::Option_list::is_z2) {
    rows.push_back({0});
    rows.push_back({1});
    rows.push_back({2});
    rows.push_back({3});
    rows.push_back({4});
    rows.push_back({3, 4, 5});
    rows.push_back({6});
  } else {
    rows.push_back({{0, 1}});
    rows.push_back({{1, 1}});
    rows.push_back({{2, 1}});
    rows.push_back({{3, 1}, {5, 4}});
    rows.push_back({{4, 1}, {5, 4}});
    rows.push_back({{5, 1}});
    rows.push_back({{6, 1}});
  }

  column_content<typename Matrix::Column> orderedRows;
  unsigned int i = 0;
  for (auto& r : rows) {
    orderedRows.clear();
    for (const auto& entry : m.get_row(i++, false)) {
      if constexpr (Matrix::Option_list::is_z2) {
        orderedRows.insert(entry.get_column_index());
      } else {
        orderedRows.insert({entry.get_column_index(), entry.get_element()});
      }
    }
    test_column_equality<typename Matrix::Column>(r, orderedRows);
  }
}